

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::cbor::
basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
::visit_bool(basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
             *this,bool value,semantic_tag param_3,ser_context *param_4,error_code *param_5)

{
  byte in_SIL;
  undefined8 in_RDI;
  basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
  *in_R8;
  uint8_t ch;
  
  ch = (uint8_t)((ulong)in_RDI >> 0x38);
  if ((in_SIL & 1) == 0) {
    bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::push_back
              ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)in_R8
               ,ch);
  }
  else {
    bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::push_back
              ((bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void> *)in_R8
               ,ch);
  }
  end_value(in_R8);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_bool(bool value, semantic_tag, const ser_context&, std::error_code&) override
    {
        if (value)
        {
            sink_.push_back(0xf5);
        }
        else
        {
            sink_.push_back(0xf4);
        }

        end_value();
        JSONCONS_VISITOR_RETURN;
    }